

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

uint64_t aom_mse_16xh_16bit_c(uint8_t *dst,int dstride,uint16_t *src,int w,int h)

{
  uint64_t uVar1;
  int in_ECX;
  uint16_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int i;
  int64_t sum;
  int num_blks;
  uint8_t *dst_temp;
  uint16_t *src_temp;
  int local_44;
  uint64_t local_40;
  uint8_t *local_30;
  uint16_t *local_28;
  
  local_40 = 0;
  local_30 = in_RDI;
  local_28 = in_RDX;
  for (local_44 = 0; local_44 < (int)(0x10 / (long)in_ECX); local_44 = local_44 + 1) {
    uVar1 = aom_mse_wxh_16bit_c(local_30,in_ESI,local_28,in_ECX,in_ECX,in_R8D);
    local_40 = uVar1 + local_40;
    local_30 = local_30 + in_ECX;
    local_28 = local_28 + in_ECX * in_R8D;
  }
  return local_40;
}

Assistant:

uint64_t aom_mse_16xh_16bit_c(uint8_t *dst, int dstride, uint16_t *src, int w,
                              int h) {
  uint16_t *src_temp = src;
  uint8_t *dst_temp = dst;
  const int num_blks = 16 / w;
  int64_t sum = 0;
  for (int i = 0; i < num_blks; i++) {
    sum += aom_mse_wxh_16bit_c(dst_temp, dstride, src_temp, w, w, h);
    dst_temp += w;
    src_temp += (w * h);
  }
  return sum;
}